

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

void absl::lts_20250127::cord_internal::CordRepBtree::Rebuild
               (CordRepBtree **stack,CordRepBtree *tree,bool consume)

{
  RefcountAndFlags *pRVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  CordRep *pCVar5;
  size_t sVar6;
  uint8_t uVar7;
  uint uVar8;
  size_t new_end;
  ulong uVar9;
  CordRepBtree *pCVar10;
  CordRepBtree *pCVar11;
  CordRepBtree *pCVar12;
  ulong uVar13;
  CordRepBtree **ppCVar14;
  undefined7 in_register_00000011;
  CordRep **ppCVar15;
  ulong uVar16;
  CordRep **ppCVar17;
  long lVar18;
  CordRepBtree *pCVar19;
  bool consume_00;
  long local_50;
  
  if ((int)CONCAT71(in_register_00000011,consume) == 0) {
    consume_00 = false;
  }
  else {
    consume_00 = (tree->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2;
  }
  bVar2 = (tree->super_CordRep).storage[1];
  bVar3 = (tree->super_CordRep).storage[2];
  if ((tree->super_CordRep).storage[0] == '\0') {
    if (bVar2 != bVar3) {
      ppCVar17 = tree->edges_ + bVar2;
LAB_00330884:
      pCVar5 = *ppCVar17;
      if (consume_00 == false) {
        if (pCVar5 == (CordRep *)0x0) {
          __assert_fail("rep != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
        }
        LOCK();
        (pCVar5->refcount).count_.super___atomic_base<int>._M_i =
             (pCVar5->refcount).count_.super___atomic_base<int>._M_i + 2;
        UNLOCK();
      }
      sVar6 = pCVar5->length;
      pCVar12 = *stack;
      bVar2 = (pCVar12->super_CordRep).storage[2];
      uVar8 = (uint)bVar2;
      bVar4 = (pCVar12->super_CordRep).storage[1];
      uVar13 = (ulong)bVar4;
      uVar9 = bVar2 - uVar13;
      if (5 < uVar9) {
        pCVar10 = (CordRepBtree *)operator_new(0x40);
        (pCVar10->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
        if (pCVar5->tag == '\x03') {
          uVar7 = pCVar5->storage[0] + '\x01';
        }
        else {
          uVar7 = '\0';
        }
        (pCVar10->super_CordRep).length = pCVar5->length;
        (pCVar10->super_CordRep).tag = '\x03';
        (pCVar10->super_CordRep).storage[0] = uVar7;
        (pCVar10->super_CordRep).storage[1] = '\0';
        (pCVar10->super_CordRep).storage[2] = '\x01';
        pCVar10->edges_[0] = pCVar5;
LAB_00330930:
        *stack = pCVar10;
        if (stack[1] != (CordRepBtree *)0x0) {
          pCVar11 = stack[1];
          lVar18 = 0;
          pCVar19 = pCVar10;
LAB_0033093f:
          local_50 = lVar18;
          pCVar12 = pCVar11;
          bVar2 = (pCVar12->super_CordRep).storage[2];
          uVar8 = (uint)bVar2;
          bVar4 = (pCVar12->super_CordRep).storage[1];
          uVar13 = (ulong)bVar4;
          uVar9 = bVar2 - uVar13;
          if (5 < uVar9) goto code_r0x00330959;
          if (uVar13 != 0) {
            (pCVar12->super_CordRep).storage[1] = '\0';
            (pCVar12->super_CordRep).storage[2] = (uint8_t)uVar9;
            if (bVar2 != bVar4) {
              ppCVar15 = pCVar12->edges_;
              uVar16 = uVar9;
              do {
                *ppCVar15 = ppCVar15[uVar13];
                ppCVar15 = ppCVar15 + 1;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
            }
            uVar8 = (uint)uVar9;
          }
          (pCVar12->super_CordRep).storage[2] = (char)uVar8 + '\x01';
          pCVar12->edges_[uVar8 & 0xff] = &pCVar19->super_CordRep;
          (pCVar12->super_CordRep).length = (pCVar12->super_CordRep).length + sVar6;
          goto LAB_00330a2c;
        }
        local_50 = 1;
        lVar18 = 0;
        goto LAB_003309c3;
      }
      if (uVar13 != 0) {
        (pCVar12->super_CordRep).storage[1] = '\0';
        (pCVar12->super_CordRep).storage[2] = (uint8_t)uVar9;
        if (bVar2 != bVar4) {
          ppCVar15 = pCVar12->edges_;
          uVar16 = uVar9;
          do {
            *ppCVar15 = ppCVar15[uVar13];
            ppCVar15 = ppCVar15 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        uVar8 = (uint)uVar9;
      }
      (pCVar12->super_CordRep).storage[2] = (char)uVar8 + '\x01';
      pCVar12->edges_[uVar8 & 0xff] = pCVar5;
      (pCVar12->super_CordRep).length = (pCVar12->super_CordRep).length + sVar6;
      local_50 = 1;
      pCVar10 = pCVar12;
      if (5 < uVar9) goto LAB_00330930;
      goto LAB_00330a30;
    }
  }
  else if (bVar2 != bVar3) {
    lVar18 = (ulong)bVar2 << 3;
    do {
      pCVar12 = *(CordRepBtree **)((long)tree->edges_ + lVar18);
      if ((pCVar12->super_CordRep).tag != '\x03') {
        __assert_fail("IsBtree()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                      ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
      }
      Rebuild(stack,pCVar12,consume_00);
      lVar18 = lVar18 + 8;
    } while ((ulong)bVar3 * 8 != lVar18);
  }
LAB_003307f6:
  if (consume) {
    if (consume_00 != false) {
      operator_delete(tree,0x40);
      return;
    }
    if (tree == (CordRepBtree *)0x0) {
      __assert_fail("rep != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0x397,"static void absl::cord_internal::CordRep::Unref(CordRep *)");
    }
    LOCK();
    pRVar1 = &(tree->super_CordRep).refcount;
    uVar8 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar8 & 1) == 0 && (int)uVar8 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar8 == 2) {
      CordRep::Destroy(&tree->super_CordRep);
      return;
    }
  }
  return;
code_r0x00330959:
  pCVar10 = (CordRepBtree *)operator_new(0x40);
  (pCVar10->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  if ((pCVar19->super_CordRep).tag == '\x03') {
    uVar7 = (pCVar19->super_CordRep).storage[0] + '\x01';
  }
  else {
    uVar7 = '\0';
  }
  (pCVar10->super_CordRep).length = (pCVar19->super_CordRep).length;
  (pCVar10->super_CordRep).tag = '\x03';
  (pCVar10->super_CordRep).storage[0] = uVar7;
  (pCVar10->super_CordRep).storage[1] = '\0';
  (pCVar10->super_CordRep).storage[2] = '\x01';
  pCVar10->edges_[0] = &pCVar19->super_CordRep;
  stack[local_50 + 1] = pCVar10;
  lVar18 = local_50 + 1;
  pCVar11 = stack[local_50 + 2];
  pCVar19 = pCVar10;
  if (stack[local_50 + 2] == (CordRepBtree *)0x0) goto code_r0x003309a7;
  goto LAB_0033093f;
code_r0x003309a7:
  local_50 = local_50 + 2;
LAB_003309c3:
  uVar7 = (pCVar12->super_CordRep).storage[0];
  if (uVar7 != (pCVar10->super_CordRep).storage[0]) {
    __assert_fail("front->height() == back->height()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x294,
                  "static CordRepBtree *absl::cord_internal::CordRepBtree::New(CordRepBtree *, CordRepBtree *)"
                 );
  }
  pCVar11 = (CordRepBtree *)operator_new(0x40);
  (pCVar11->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  (pCVar11->super_CordRep).length =
       (pCVar10->super_CordRep).length + (pCVar12->super_CordRep).length;
  (pCVar11->super_CordRep).tag = '\x03';
  (pCVar11->super_CordRep).storage[0] = uVar7 + '\x01';
  (pCVar11->super_CordRep).storage[1] = '\0';
  (pCVar11->super_CordRep).storage[2] = '\x02';
  pCVar11->edges_[0] = &pCVar12->super_CordRep;
  pCVar11->edges_[1] = &pCVar10->super_CordRep;
  stack[local_50] = pCVar11;
  local_50 = lVar18;
LAB_00330a2c:
  local_50 = local_50 + 2;
LAB_00330a30:
  pCVar12 = stack[local_50];
  if (pCVar12 != (CordRepBtree *)0x0) {
    ppCVar14 = stack + local_50 + 1;
    do {
      (pCVar12->super_CordRep).length = (pCVar12->super_CordRep).length + sVar6;
      pCVar12 = *ppCVar14;
      ppCVar14 = ppCVar14 + 1;
    } while (pCVar12 != (CordRepBtree *)0x0);
  }
  ppCVar17 = ppCVar17 + 1;
  if (ppCVar17 == tree->edges_ + bVar3) goto LAB_003307f6;
  goto LAB_00330884;
}

Assistant:

void CordRepBtree::Rebuild(CordRepBtree** stack, CordRepBtree* tree,
                           bool consume) {
  bool owned = consume && tree->refcount.IsOne();
  if (tree->height() == 0) {
    for (CordRep* edge : tree->Edges()) {
      if (!owned) edge = CordRep::Ref(edge);
      size_t height = 0;
      size_t length = edge->length;
      CordRepBtree* node = stack[0];
      OpResult result = node->AddEdge<kBack>(true, edge, length);
      while (result.action == CordRepBtree::kPopped) {
        stack[height] = result.tree;
        if (stack[++height] == nullptr) {
          result.action = CordRepBtree::kSelf;
          stack[height] = CordRepBtree::New(node, result.tree);
        } else {
          node = stack[height];
          result = node->AddEdge<kBack>(true, result.tree, length);
        }
      }
      while (stack[++height] != nullptr) {
        stack[height]->length += length;
      }
    }
  } else {
    for (CordRep* rep : tree->Edges()) {
      Rebuild(stack, rep->btree(), owned);
    }
  }
  if (consume) {
    if (owned) {
      CordRepBtree::Delete(tree);
    } else {
      CordRepBtree::Unref(tree);
    }
  }
}